

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tests.cpp
# Opt level: O0

void __thiscall
optCompare_nulloptOptNotEmpty_Test::~optCompare_nulloptOptNotEmpty_Test
          (optCompare_nulloptOptNotEmpty_Test *this)

{
  optCompare_nulloptOptNotEmpty_Test *this_local;
  
  ~optCompare_nulloptOptNotEmpty_Test(this);
  operator_delete(this,0x10);
  return;
}

Assistant:

TEST(optCompare, nulloptOptNotEmpty)
{
  using opt_int = opt<int, opt_null_value_policy<int, -1>>;
  opt_int i{1};
  EXPECT_FALSE(nullopt == i);
  EXPECT_TRUE(nullopt != i);
  EXPECT_TRUE(nullopt < i);
  EXPECT_FALSE(nullopt > i);
  EXPECT_TRUE(nullopt <= i);
  EXPECT_FALSE(nullopt >= i);
}